

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

bool __thiscall glslang::TArraySizes::sameInnerArrayness(TArraySizes *this,TArraySizes *rhs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  TIntermTyped *pTVar5;
  TIntermTyped *pTVar6;
  int local_24;
  int d;
  TArraySizes *rhs_local;
  TArraySizes *this_local;
  
  iVar1 = TSmallArrayVector::size(&this->sizes);
  iVar2 = TSmallArrayVector::size(&rhs->sizes);
  if (iVar1 == iVar2) {
    for (local_24 = 1; iVar1 = TSmallArrayVector::size(&this->sizes), local_24 < iVar1;
        local_24 = local_24 + 1) {
      uVar3 = TSmallArrayVector::getDimSize(&this->sizes,local_24);
      uVar4 = TSmallArrayVector::getDimSize(&rhs->sizes,local_24);
      if (uVar3 != uVar4) {
        return false;
      }
      pTVar5 = TSmallArrayVector::getDimNode(&this->sizes,local_24);
      pTVar6 = TSmallArrayVector::getDimNode(&rhs->sizes,local_24);
      if (pTVar5 != pTVar6) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool sameInnerArrayness(const TArraySizes& rhs) const
    {
        if (sizes.size() != rhs.sizes.size())
            return false;

        for (int d = 1; d < sizes.size(); ++d) {
            if (sizes.getDimSize(d) != rhs.sizes.getDimSize(d) ||
                sizes.getDimNode(d) != rhs.sizes.getDimNode(d))
                return false;
        }

        return true;
    }